

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O1

string * __thiscall
cppcms::http::protocol::unquote<char_const*>
          (string *__return_storage_ptr__,protocol *this,char **begin,char *end)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  char **ppcVar4;
  char **ppcVar5;
  
  ppcVar4 = *(char ***)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((ppcVar4 < begin) && (*(char *)ppcVar4 == '\"')) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    bVar3 = false;
    ppcVar4 = (char **)((long)ppcVar4 + 1);
    do {
      if (begin <= ppcVar4) {
        __return_storage_ptr__->_M_string_length = 0;
        *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
        return __return_storage_ptr__;
      }
      ppcVar5 = (char **)((long)ppcVar4 + 1);
      cVar1 = *(char *)ppcVar4;
      if (cVar1 == '\"') {
        *(char ***)this = ppcVar5;
        bVar3 = true;
      }
      else if (ppcVar5 < begin && cVar1 == '\\') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        ppcVar5 = (char **)((long)ppcVar4 + 2);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      ppcVar4 = ppcVar5;
    } while (cVar1 != '\"');
    if ((!bVar3) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &__return_storage_ptr__->field_2)) {
      operator_delete(pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}